

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::CopySingletonInstance
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          DynamicTypeHandler *typeHandler)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->singletonInstance).ptr == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    return;
  }
  bVar2 = DynamicTypeHandler::ShouldFixAnyProperties();
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0xa68,"(AreSingletonInstancesNeeded())",
                                "AreSingletonInstancesNeeded()");
    if (!bVar2) goto LAB_00db4b1e;
    *puVar3 = 0;
  }
  if ((DynamicObject *)(((this->singletonInstance).ptr)->super_RecyclerWeakReferenceBase).strongRef
      != instance) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0xa69,"(this->singletonInstance->Get() == instance)",
                                "this->singletonInstance->Get() == instance");
    if (!bVar2) {
LAB_00db4b1e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (*typeHandler->_vptr_DynamicTypeHandler[0x60])(typeHandler,(this->singletonInstance).ptr);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::CopySingletonInstance(DynamicObject* instance, DynamicTypeHandler* typeHandler)
    {
        if (this->singletonInstance != nullptr)
        {
            Assert(AreSingletonInstancesNeeded());
            Assert(this->singletonInstance->Get() == instance);
            typeHandler->SetSingletonInstanceUnchecked(this->singletonInstance);
        }
    }